

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_insert(set s,set_key key,set_value value)

{
  int iVar1;
  bucket b_00;
  bucket b_01;
  pair ppVar2;
  void *in_RDX;
  long in_RSI;
  long *in_RDI;
  pair p;
  bucket b;
  size_t index;
  set_hash h;
  void *in_stack_ffffffffffffffb8;
  int local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_RDX == (void *)0x0)) {
    log_write_impl_va("metacall",0xcc,"set_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                      ,LOG_LEVEL_ERROR,"Invalid set insertion parameters");
    local_4 = 1;
  }
  else {
    b_00 = (bucket)(*(code *)in_RDI[4])(in_RSI);
    b_01 = (bucket)(in_RDI[3] + (long)((ulong)b_00 % (ulong)in_RDI[1]) * 0x18);
    ppVar2 = bucket_get_pair(b_00,(comparable_callback)((ulong)b_00 % (ulong)in_RDI[1]),b_01);
    if (ppVar2 == (pair)0x0) {
      iVar1 = bucket_insert(b_01,(void *)0x0,in_stack_ffffffffffffffb8);
      if (iVar1 == 0) {
        *in_RDI = *in_RDI + 1;
        local_4 = set_bucket_realloc((set)value);
      }
      else {
        log_write_impl_va("metacall",0xe0,"set_insert",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                          ,LOG_LEVEL_ERROR,"Invalid set bucket insertion");
        local_4 = 1;
      }
    }
    else {
      ppVar2->value = in_RDX;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int set_insert(set s, set_key key, set_value value)
{
	set_hash h;
	size_t index;
	bucket b;
	pair p;

	if (s == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set insertion parameters");
		return 1;
	}

	h = s->hash_cb(key);

	index = h % s->capacity;

	b = &s->buckets[index];

	p = bucket_get_pair(b, s->compare_cb, key);

	if (p != NULL)
	{
		p->value = value;
		return 0;
	}

	if (bucket_insert(b, key, value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket insertion");
		return 1;
	}

	++s->count;

	return set_bucket_realloc(s);
}